

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O1

void __thiscall
CoreML::TreeEnsembleRegressor::TreeEnsembleRegressor
          (TreeEnsembleRegressor *this,string *predictedValueOutput,string *description)

{
  Model *this_00;
  element_type *peVar1;
  string *psVar2;
  TreeEnsembleRegressor *this_01;
  ModelDescription *this_02;
  Model MStack_38;
  
  Model::Model(&MStack_38,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&MStack_38,false);
  Model::~Model(&MStack_38);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_003dc518;
  this_00 = (this->super_TreeEnsembleBase).super_Model.m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 0x12e) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 0x12e;
    this_01 = (TreeEnsembleRegressor *)operator_new(0x20);
    Specification::TreeEnsembleRegressor::TreeEnsembleRegressor(this_01);
    (this_00->Type_).treeensembleregressor_ = this_01;
  }
  this->tree_regressor_parameters = (TreeEnsembleRegressor *)this_00->Type_;
  peVar1 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->description_ == (ModelDescription *)0x0) {
    this_02 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(this_02);
    peVar1->description_ = this_02;
  }
  psVar2 = (peVar1->description_->predictedfeaturename_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&peVar1->description_->predictedfeaturename_,predictedValueOutput);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  return;
}

Assistant:

TreeEnsembleRegressor::TreeEnsembleRegressor
    (const std::string& predictedValueOutput,
     const std::string& description)
    : TreeEnsembleBase(Model(description), false /* isClassifier */)
    , tree_regressor_parameters(m_spec->mutable_treeensembleregressor())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedValueOutput);
    }